

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Dam_PrintDiv(Dam_Man_t *p,int iDiv)

{
  int iVar1;
  int Lit;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  abctime time;
  char *pStr;
  float fVar5;
  char Buffer [100];
  
  if (iDiv == 0) {
    printf("Final statistics after extracting %6d divisors:          ",(ulong)(uint)p->nDivs);
  }
  else {
    iVar1 = Hash_IntObjData0(p->vHash,iDiv);
    Lit = Hash_IntObjData1(p->vHash,iDiv);
    printf("Div%5d : ",(ulong)(p->nDivs + 1));
    printf("D%-8d = ",iDiv);
    iVar2 = Abc_LitIsCompl(iVar1);
    uVar3 = Abc_Lit2Var(iVar1);
    sprintf(Buffer,"%c%d",(ulong)(0x21 - (iVar2 == 0)),(ulong)uVar3);
    printf("%8s ",Buffer);
    printf("%c  ",(ulong)(iVar1 < Lit ^ 0x2b));
    iVar1 = Abc_LitIsCompl(Lit);
    uVar3 = Abc_Lit2Var(Lit);
    sprintf(Buffer,"%c%d",(ulong)(0x21 - (iVar1 == 0)),(ulong)uVar3);
    printf("%8s   ",Buffer);
    fVar5 = Vec_FltEntry(p->vCounts,iDiv);
    printf("Weight %9.2f  ",(double)fVar5);
  }
  iVar1 = p->vHash->vObjs->nSize;
  printf("Divs =%8d  ",(ulong)(iVar1 / 4 - 1),(long)iVar1 % 4 & 0xffffffff);
  pStr = (char *)(ulong)(uint)(p->nAnds - p->nGain);
  printf("Ands =%8d  ");
  aVar4 = Abc_Clock();
  Abc_PrintTime((int)aVar4 - (int)p->clkStart,pStr,time);
  return;
}

Assistant:

void Dam_PrintDiv( Dam_Man_t * p, int iDiv )
{
    if ( iDiv == 0 )
        printf( "Final statistics after extracting %6d divisors:          ", p->nDivs );
    else
    {
        char Buffer[100];
        int iData0 = Hash_IntObjData0(p->vHash, iDiv);
        int iData1 = Hash_IntObjData1(p->vHash, iDiv);
        printf( "Div%5d : ",  p->nDivs+1 );
        printf( "D%-8d = ",   iDiv );
        sprintf( Buffer, "%c%d", Abc_LitIsCompl(iData0)? '!':' ', Abc_Lit2Var(iData0) );
        printf( "%8s ",   Buffer );
        printf( "%c  ",     (iData0 < iData1) ? '*' : '+' );
        sprintf( Buffer, "%c%d", Abc_LitIsCompl(iData1)? '!':' ', Abc_Lit2Var(iData1) );
        printf( "%8s   ", Buffer );
        printf( "Weight %9.2f  ", Vec_FltEntry(p->vCounts, iDiv) );
    }
    printf( "Divs =%8d  ",  Hash_IntManEntryNum(p->vHash) );
    printf( "Ands =%8d  ",  p->nAnds - p->nGain );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
}